

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Metaiterators.hpp
# Opt level: O1

ItemList *
Lib::UniquePersistentIterator<Kernel::BooleanSubtermIt>::getUniqueItemList
          (BooleanSubtermIt *inn,size_t *sizeRef)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  ItemList *pIVar3;
  size_t sVar4;
  ItemList *pIVar5;
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  iset;
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  local_38;
  
  Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
  ::Recycled(&local_38);
  sVar4 = 0;
  pIVar5 = (ItemList *)0x0;
  do {
    *sizeRef = sVar4;
    do {
      iVar2 = (*(inn->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore[2])(inn);
      if ((char)iVar2 == '\0') {
        Recycled<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
        ::~Recycled(&local_38);
        return pIVar5;
      }
      iVar2 = (*(inn->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore[3])(inn);
      bVar1 = DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>::insert
                        ((DHMap<Kernel::TermList,_Lib::EmptyStruct,_Lib::DefaultHash,_Lib::DefaultHash2>
                          *)local_38._self._M_t.
                            super___uniq_ptr_impl<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>,_std::default_delete<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_std::default_delete<Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_>_>
                            .
                            super__Head_base<0UL,_Lib::DHSet<Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>_*,_false>
                            ._M_head_impl,CONCAT44(extraout_var,iVar2));
    } while (!bVar1);
    pIVar3 = (ItemList *)
             FixedSizeAllocator<16UL>::alloc
                       ((FixedSizeAllocator<16UL> *)(GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x18));
    (pIVar3->_head)._content = CONCAT44(extraout_var,iVar2);
    pIVar3->_tail = pIVar5;
    sVar4 = *sizeRef + 1;
    pIVar5 = pIVar3;
  } while( true );
}

Assistant:

static ItemList* getUniqueItemList(Inner& inn, size_t& sizeRef)
  {
    ItemList* res=0;
    Recycled<ItemSet> iset;

    sizeRef=0;
    while(inn.hasNext()) {
      T el=inn.next();
      if(iset->insert(el)) {
	ItemList::push(el, res);
	sizeRef++;
      }
    }

    return res;
  }